

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O2

void __thiscall HEkkDual::minorUpdateDual(HEkkDual *this)

{
  int iCol;
  double *pdVar1;
  long lVar2;
  HighsInt ich;
  ulong uVar3;
  HighsInt i;
  long lVar4;
  double dVar5;
  
  dVar5 = this->theta_dual;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    HEkkDualRow::updateDual(&this->dualRow,dVar5);
    if (this->slice_PRICE != 0) {
      lVar2 = 0;
      for (lVar4 = 0; lVar4 < this->slice_num; lVar4 = lVar4 + 1) {
        HEkkDualRow::updateDual
                  ((HEkkDualRow *)
                   ((long)&((this->slice_dualRow).
                            super__Vector_base<HEkkDualRow,_std::allocator<HEkkDualRow>_>._M_impl.
                            super__Vector_impl_data._M_start)->ekk_instance_ + lVar2),
                   this->theta_dual);
        lVar2 = lVar2 + 0x150;
      }
    }
  }
  else {
    shiftCost(this,this->variable_in,-this->workDual[this->variable_in]);
  }
  pdVar1 = this->workDual;
  pdVar1[this->variable_in] = 0.0;
  iCol = this->variable_out;
  pdVar1[iCol] = -this->theta_dual;
  shiftBack(this,iCol);
  HEkkDualRow::updateFlip(&this->dualRow,this->multi_finish[this->multi_nFinish].col_BFRT);
  for (uVar3 = 0; (long)uVar3 < (long)this->multi_num; uVar3 = uVar3 + 1) {
    if ((uVar3 == (uint)this->multi_iChoice) || (-1 < this->multi_choice[uVar3].row_out)) {
      lVar2 = 0;
      for (lVar4 = 0; lVar4 < (this->dualRow).workCount; lVar4 = lVar4 + 1) {
        dVar5 = HighsSparseMatrix::computeDot
                          (this->a_matrix,&this->multi_choice[uVar3].row_ep.array,
                           *(HighsInt *)
                            ((long)&((this->dualRow).workData.
                                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first + lVar2));
        this->multi_choice[uVar3].baseValue =
             this->multi_choice[uVar3].baseValue -
             dVar5 * *(double *)
                      ((long)&((this->dualRow).workData.
                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->second + lVar2);
        lVar2 = lVar2 + 0x10;
      }
    }
  }
  return;
}

Assistant:

void HEkkDual::minorUpdateDual() {
  /**
   * 1. Update the dual solution
   *    XXX Data parallel (depends on the ap partition before)
   */
  if (theta_dual == 0) {
    shiftCost(variable_in, -workDual[variable_in]);
  } else {
    dualRow.updateDual(theta_dual);
    if (slice_PRICE) {
      for (HighsInt i = 0; i < slice_num; i++)
        slice_dualRow[i].updateDual(theta_dual);
    }
  }
  workDual[variable_in] = 0;
  workDual[variable_out] = -theta_dual;
  shiftBack(variable_out);

  /**
   * 2. Apply global bound flip
   */
  dualRow.updateFlip(multi_finish[multi_nFinish].col_BFRT);

  /**
   * 3. Apply local bound flips
   */
  for (HighsInt ich = 0; ich < multi_num; ich++) {
    if (ich == multi_iChoice || multi_choice[ich].row_out >= 0) {
      HVector* this_ep = &multi_choice[ich].row_ep;
      for (HighsInt i = 0; i < dualRow.workCount; i++) {
        double dot = a_matrix->computeDot(*this_ep, dualRow.workData[i].first);
        multi_choice[ich].baseValue -= dualRow.workData[i].second * dot;
      }
    }
  }
}